

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_path_table(archive_write *a,int type_m,vdd *vdd)

{
  ulong local_38;
  size_t path_table_size;
  int r;
  int depth;
  vdd *vdd_local;
  int type_m_local;
  archive_write *a_local;
  
  path_table_size._0_4_ = 0;
  local_38 = 0;
  path_table_size._4_4_ = 0;
  while( true ) {
    if (vdd->max_depth <= path_table_size._4_4_) {
      if ((local_38 & 0xfff) != 0) {
        path_table_size._0_4_ = write_null(a,0x1000 - (local_38 & 0xfff));
      }
      return (int)path_table_size;
    }
    path_table_size._0_4_ = _write_path_table(a,type_m,path_table_size._4_4_,vdd);
    if ((int)path_table_size < 0) break;
    local_38 = (long)(int)path_table_size + local_38;
    path_table_size._4_4_ = path_table_size._4_4_ + 1;
  }
  return (int)path_table_size;
}

Assistant:

static int
_write_path_table(struct archive_write *a, int type_m, int depth,
    struct vdd *vdd)
{
	unsigned char *bp, *wb;
	struct isoent **ptbl;
	size_t wbremaining;
	int i, r, wsize;

	if (vdd->pathtbl[depth].cnt == 0)
		return (0);

	wsize = 0;
	wb = wb_buffptr(a);
	wbremaining = wb_remaining(a);
	bp = wb - 1;
	ptbl = vdd->pathtbl[depth].sorted;
	for (i = 0; i < vdd->pathtbl[depth].cnt; i++) {
		struct isoent *np;
		size_t len;

		np = ptbl[i];
		if (np->identifier == NULL)
			len = 1; /* root directory */
		else
			len = np->id_len;
		if (wbremaining - ((bp+1) - wb) < (len + 1 + 8)) {
			r = wb_consume(a, (bp+1) - wb);
			if (r < 0)
				return (r);
			wb = wb_buffptr(a);
			wbremaining = wb_remaining(a);
			bp = wb -1;
		}
		/* Length of Directory Identifier */
		set_num_711(bp+1, (unsigned char)len);
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (type_m)
			set_num_732(bp+3, np->dir_location);
		else
			set_num_731(bp+3, np->dir_location);
		/* Parent Directory Number */
		if (type_m)
			set_num_722(bp+7, np->parent->dir_number);
		else
			set_num_721(bp+7, np->parent->dir_number);
		/* Directory Identifier */
		if (np->identifier == NULL)
			bp[9] = 0;
		else
			memcpy(&bp[9], np->identifier, len);
		if (len & 0x01) {
			/* Padding Field */
			bp[9+len] = 0;
			len++;
		}
		wsize += 8 + (int)len;
		bp += 8 + len;
	}
	if ((bp + 1) > wb) {
		r = wb_consume(a, (bp+1)-wb);
		if (r < 0)
			return (r);
	}
	return (wsize);
}